

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

int xmlPatternMatch(xmlPatternPtr comp,xmlNodePtr node)

{
  xmlStepOpPtr pxVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  xmlStepOpPtr pxVar6;
  xmlChar *str2;
  xmlChar *pxVar7;
  xmlNodePtr node_00;
  _xmlNode *p_Var8;
  int iVar9;
  xmlStepStates local_48;
  
  iVar9 = -1;
  if (node != (xmlNodePtr)0x0 && comp != (xmlPatternPtr)0x0) {
    do {
      local_48.nbstates = 0;
      local_48.maxstates = 0;
      local_48.states = (xmlStepStatePtr)0x0;
      iVar9 = -1;
      if (node == (xmlNodePtr)0x0) {
        bVar2 = false;
      }
      else {
        if (0 < comp->nbStep) {
          iVar9 = 0;
          node_00 = node;
          do {
            pxVar1 = comp->steps;
            if (pxVar1[iVar9].op < (XML_OP_ALL|XML_OP_ROOT)) {
              pxVar6 = pxVar1 + iVar9;
              switch(pxVar1[iVar9].op) {
              case XML_OP_END:
                goto switchD_00172b5a_caseD_0;
              case XML_OP_ROOT:
                if ((node_00->type != XML_NAMESPACE_DECL) &&
                   (node_00 = node_00->parent,
                   (node_00->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE))
                goto LAB_00172e6b;
                break;
              case XML_OP_ELEM:
                if (node_00->type == XML_ELEMENT_NODE) {
LAB_00172c90:
                  pxVar7 = pxVar6->value;
                  if (pxVar7 != (xmlChar *)0x0) {
                    if ((*pxVar7 != *node_00->name) ||
                       (iVar4 = xmlStrEqual(pxVar7,node_00->name), iVar4 == 0)) break;
                    if (node_00->ns == (xmlNs *)0x0) {
                      if (pxVar6->value2 != (xmlChar *)0x0) break;
                    }
                    else {
                      str2 = node_00->ns->href;
                      if (str2 != (xmlChar *)0x0) {
                        pxVar7 = pxVar6->value2;
                        goto LAB_00172d33;
                      }
                    }
                  }
                  goto LAB_00172e6b;
                }
                break;
              case XML_OP_CHILD:
                iVar4 = 8;
                if (((node_00->type < XML_DTD_NODE) &&
                    ((0x2202U >> (node_00->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0))
                   && (pxVar6->value != (xmlChar *)0x0)) {
                  for (p_Var8 = node_00->children; p_Var8 != (_xmlNode *)0x0; p_Var8 = p_Var8->next)
                  {
                    if (p_Var8->type == XML_ELEMENT_NODE) {
                      if ((*pxVar6->value == *p_Var8->name) &&
                         (iVar3 = xmlStrEqual(pxVar6->value,p_Var8->name), iVar3 != 0)) {
                        iVar4 = 5;
                        break;
                      }
                    }
                  }
                }
                if (iVar4 == 5) goto LAB_00172e6b;
                if (iVar4 != 8) {
LAB_00172ebc:
                  bVar2 = false;
                  iVar9 = -1;
                  goto LAB_00172ea9;
                }
                break;
              case XML_OP_ATTR:
                if ((node_00->type == XML_ATTRIBUTE_NODE) &&
                   ((pxVar7 = pxVar6->value, pxVar7 == (xmlChar *)0x0 ||
                    ((*pxVar7 == *node_00->name &&
                     (iVar4 = xmlStrEqual(pxVar7,node_00->name), iVar4 != 0)))))) {
                  pxVar7 = pxVar6->value2;
                  if (node_00->ns != (xmlNs *)0x0) {
                    if (pxVar7 == (xmlChar *)0x0) goto LAB_00172e6b;
                    str2 = node_00->ns->href;
                    goto LAB_00172d3c;
                  }
joined_r0x00172d5a:
                  if (pxVar7 == (xmlChar *)0x0) goto LAB_00172e6b;
                }
                break;
              case XML_OP_PARENT:
                if (((XML_NAMESPACE_DECL < node_00->type) ||
                    ((0x42200U >> (node_00->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)
                    ) && (node_00 = node_00->parent, node_00 != (xmlNodePtr)0x0)) goto LAB_00172c90;
                break;
              case XML_OP_ANCESTOR:
                if (pxVar6->value == (xmlChar *)0x0) {
                  iVar9 = iVar9 + 1;
                  if (pxVar1[iVar9].op != XML_OP_ELEM) {
                    if (pxVar1[iVar9].op != XML_OP_ROOT) break;
                    goto switchD_00172b5a_caseD_0;
                  }
                  pxVar6 = pxVar1 + iVar9;
                  if (pxVar6->value == (xmlChar *)0x0) goto LAB_00172ebc;
                }
                if ((node_00 != (xmlNodePtr)0x0) &&
                   ((XML_NAMESPACE_DECL < node_00->type ||
                    ((0x42200U >> (node_00->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)
                    ))) {
                  do {
                    while( true ) {
                      do {
                        do {
                          node_00 = node_00->parent;
                          if (node_00 == (xmlNodePtr)0x0) goto LAB_00172e3d;
                        } while (node_00->type != XML_ELEMENT_NODE);
                      } while ((*pxVar6->value != *node_00->name) ||
                              (iVar4 = xmlStrEqual(pxVar6->value,node_00->name), iVar4 == 0));
                      if (node_00->ns == (xmlNs *)0x0) break;
                      pxVar7 = node_00->ns->href;
                      if (((pxVar7 != (xmlChar *)0x0) && (pxVar6->value2 != (xmlChar *)0x0)) &&
                         (iVar4 = xmlStrEqual(pxVar6->value2,pxVar7), iVar4 != 0))
                      goto LAB_00172dff;
                    }
                  } while (pxVar6->value2 != (xmlChar *)0x0);
LAB_00172dff:
                  xmlPatPushState(&local_48,iVar9 - (uint)(pxVar6->op != XML_OP_ANCESTOR),node_00);
                  goto LAB_00172e6b;
                }
                break;
              case XML_OP_NS:
                if (node_00->type == XML_ELEMENT_NODE) {
                  if (node_00->ns == (xmlNs *)0x0) {
                    pxVar7 = pxVar6->value;
                    goto joined_r0x00172d5a;
                  }
                  str2 = node_00->ns->href;
                  if (str2 == (xmlChar *)0x0) goto LAB_00172e6b;
                  pxVar7 = pxVar6->value;
LAB_00172d33:
                  if (pxVar7 != (xmlChar *)0x0) {
LAB_00172d3c:
                    iVar4 = xmlStrEqual(pxVar7,str2);
                    if (iVar4 != 0) goto LAB_00172e6b;
                  }
                }
                break;
              case XML_OP_ALL:
                if (node_00->type == XML_ELEMENT_NODE) goto LAB_00172e6b;
              }
LAB_00172e3d:
              if (local_48.states == (xmlStepStatePtr)0x0) {
                iVar9 = 0;
                bVar2 = true;
                goto LAB_00172ea9;
              }
              if (local_48.nbstates < 1) {
                iVar9 = 0;
                bVar2 = true;
                goto LAB_00172e99;
              }
              uVar5 = local_48.nbstates - 1;
              local_48.nbstates = uVar5;
              iVar9 = local_48.states[uVar5].step;
              node_00 = local_48.states[uVar5].node;
            }
            else {
LAB_00172e6b:
              iVar9 = iVar9 + 1;
            }
          } while (iVar9 < comp->nbStep);
        }
switchD_00172b5a_caseD_0:
        iVar9 = 1;
        bVar2 = false;
        if (local_48.states != (xmlStepStatePtr)0x0) {
LAB_00172e99:
          (*xmlFree)(local_48.states);
        }
      }
LAB_00172ea9:
      if (!bVar2) {
        return iVar9;
      }
      comp = comp->next;
    } while (comp != (_xmlPattern *)0x0);
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int
xmlPatternMatch(xmlPatternPtr comp, xmlNodePtr node)
{
    int ret = 0;

    if ((comp == NULL) || (node == NULL))
        return(-1);

    while (comp != NULL) {
        ret = xmlPatMatch(comp, node);
	if (ret != 0)
	    return(ret);
	comp = comp->next;
    }
    return(ret);
}